

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *p,Vec_Int_t *vEquivs,Vec_Str_t *vStatus)

{
  undefined8 uVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_54;
  uint local_50;
  int fChanges;
  int Count1;
  int Count0;
  int Total;
  int fPrev;
  int iRepr;
  int iObj;
  int Iter;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Vec_Str_t *vStatus_local;
  Vec_Int_t *vEquivs_local;
  Gia_Man_t *p_local;
  
  iVar4 = Vec_StrSize(vStatus);
  iVar5 = Vec_IntSize(vEquivs);
  if (iVar4 << 1 != iVar5) {
    __assert_fail("Vec_StrSize(vStatus) * 2 == Vec_IntSize(vEquivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x34b,"int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  iObj = 0;
  while( true ) {
    bVar8 = false;
    if (iObj < p->nObjs) {
      pObjRo = Gia_ManObj(p,iObj);
      bVar8 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    if ((*(ulong *)pObjRo >> 0x3e & 1) != 0) {
      __assert_fail("pObj->fMark1 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                    ,0x34f,
                    "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)");
    }
    Gia_ObjHasRepr(p,iObj);
    iObj = iObj + 1;
  }
  fChanges = 0;
  for (iObj = 0; iVar4 = Vec_StrSize(vStatus), iObj < iVar4; iObj = iObj + 1) {
    iVar4 = Vec_IntEntry(vEquivs,iObj << 1);
    iVar5 = Vec_IntEntry(vEquivs,iObj * 2 + 1);
    iVar6 = Gia_ObjRepr(p,iVar5);
    if (iVar4 != iVar6) {
      __assert_fail("iRepr == Gia_ObjRepr(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                    ,0x358,
                    "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)");
    }
    cVar3 = Vec_StrEntry(vStatus,iObj);
    if (cVar3 != '\x01') {
      pGVar7 = Gia_ManObj(p,iVar5);
      *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
      fChanges = fChanges + 1;
    }
  }
  for (iRepr = 0; iRepr < 100; iRepr = iRepr + 1) {
    local_54 = 0;
    iObj = 1;
    while( true ) {
      bVar8 = false;
      if (iObj < p->nObjs) {
        pObjRo = Gia_ManObj(p,iObj);
        bVar8 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar4 = Gia_ObjIsCi(pObjRo);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsAnd(pObjRo);
        if ((iVar4 == 0) && (iVar4 = Gia_ObjIsCo(pObjRo), iVar4 == 0)) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                        ,0x366,
                        "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)")
          ;
        }
        iVar4 = Gia_ObjIsAnd(pObjRo);
        if (iVar4 == 0) {
          pGVar7 = Gia_ObjFanin0(pObjRo);
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xbfffffffffffffff |
               (ulong)((uint)((ulong)*(undefined8 *)pObjRo >> 0x3e) & 1 |
                      (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
        }
        else {
          pGVar7 = Gia_ObjFanin0(pObjRo);
          uVar1 = *(undefined8 *)pGVar7;
          pGVar7 = Gia_ObjFanin1(pObjRo);
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xbfffffffffffffff |
               (ulong)((uint)((ulong)*(undefined8 *)pObjRo >> 0x3e) & 1 |
                      (uint)((ulong)uVar1 >> 0x3e) & 1 |
                      (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
        }
      }
      iObj = iObj + 1;
    }
    iObj = 0;
    while( true ) {
      iVar4 = Gia_ManRegNum(p);
      bVar8 = false;
      if (iObj < iVar4) {
        iVar4 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar4 + iObj);
        bVar8 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar4 = Gia_ManPiNum(p);
          _Iter = Gia_ManCi(p,iVar4 + iObj);
          bVar8 = _Iter != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar8) break;
      uVar2 = *(ulong *)_Iter;
      *(ulong *)_Iter =
           *(ulong *)_Iter & 0xbfffffffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)pObjRo >> 0x3e) & 1) << 0x3e;
      local_54 = ((uint)(uVar2 >> 0x3e) & 1 ^ (uint)(*(ulong *)_Iter >> 0x3e) & 1) + local_54;
      iObj = iObj + 1;
    }
    if (local_54 == 0) break;
  }
  local_50 = 0;
  iObj = 0;
  while( true ) {
    bVar8 = false;
    if (iObj < p->nObjs) {
      pObjRo = Gia_ManObj(p,iObj);
      bVar8 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    if (((*(ulong *)pObjRo >> 0x3e & 1) != 0) && (iVar4 = Gia_ObjHasRepr(p,iObj), iVar4 != 0)) {
      local_50 = local_50 + 1;
    }
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff;
    iObj = iObj + 1;
  }
  printf("%5d -> %5d (%3d)  ",(ulong)(uint)fChanges,(ulong)local_50,(ulong)(uint)iRepr);
  return 0;
}

Assistant:

int Cec_ManLSCorrAnalyzeDependence( Gia_Man_t * p, Vec_Int_t * vEquivs, Vec_Str_t * vStatus )
{
    Gia_Obj_t * pObj, * pObjRo;
    int i, Iter, iObj, iRepr, fPrev, Total, Count0, Count1;
    assert( Vec_StrSize(vStatus) * 2 == Vec_IntSize(vEquivs) );
    Total = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( pObj->fMark1 == 0 );
        if ( Gia_ObjHasRepr(p, i) )
            Total++;
    }
    Count0 = 0;
    for ( i = 0; i < Vec_StrSize(vStatus); i++ )
    {
        iRepr = Vec_IntEntry(vEquivs, 2*i);
        iObj = Vec_IntEntry(vEquivs, 2*i+1);
        assert( iRepr == Gia_ObjRepr(p, iObj) );
        if ( Vec_StrEntry(vStatus, i) != 1 ) // disproved or undecided
        {
            Gia_ManObj(p, iObj)->fMark1 = 1;
            Count0++;
        }
    }
    for ( Iter = 0; Iter < 100; Iter++ )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
//            fPrev = pObj->fMark1;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fMark1 |= Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else
                pObj->fMark1 |= Gia_ObjFanin0(pObj)->fMark1;
//            fChanges += fPrev ^ pObj->fMark1;
        }
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
        {
            fPrev = pObjRo->fMark1;
            pObjRo->fMark1 = pObj->fMark1;
            fChanges += fPrev ^ pObjRo->fMark1;
        }
        if ( fChanges == 0 )
            break;
    }
    Count1 = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( pObj->fMark1 && Gia_ObjHasRepr(p, i) )
            Count1++;
        pObj->fMark1 = 0;
    }
    printf( "%5d -> %5d (%3d)  ", Count0, Count1, Iter );
    return 0;
}